

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_currency.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::CombinedCurrencyMatcher::match
          (CombinedCurrencyMatcher *this,StringSegment *segment,ParsedNumber *result,
          UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  bool local_5d;
  bool local_55;
  int32_t overlap_1;
  int32_t overlap;
  bool maybeMore;
  int32_t initialOffset;
  UErrorCode *status_local;
  ParsedNumber *result_local;
  StringSegment *segment_local;
  CombinedCurrencyMatcher *this_local;
  
  if (result->currencyCode[0] == L'\0') {
    iVar4 = StringSegment::getOffset(segment);
    bVar2 = false;
    bVar1 = ParsedNumber::seenNumber(result);
    if ((bVar1) && (UVar3 = UnicodeString::isEmpty(&this->beforeSuffixInsert), UVar3 == '\0')) {
      iVar6 = StringSegment::getCommonPrefixLength(segment,&this->beforeSuffixInsert);
      iVar5 = UnicodeString::length(&this->beforeSuffixInsert);
      if (iVar6 == iVar5) {
        StringSegment::adjustOffset(segment,iVar6);
      }
      iVar5 = StringSegment::length(segment);
      bVar2 = iVar6 == iVar5;
    }
    local_55 = true;
    if (!bVar2) {
      local_55 = matchCurrency(this,segment,result,status);
    }
    overlap_1._3_1_ = local_55;
    if (result->currencyCode[0] == L'\0') {
      StringSegment::setOffset(segment,iVar4);
      this_local._7_1_ = local_55;
    }
    else {
      bVar2 = ParsedNumber::seenNumber(result);
      if ((!bVar2) && (UVar3 = UnicodeString::isEmpty(&this->afterPrefixInsert), UVar3 == '\0')) {
        iVar4 = StringSegment::getCommonPrefixLength(segment,&this->afterPrefixInsert);
        iVar6 = UnicodeString::length(&this->afterPrefixInsert);
        if (iVar4 == iVar6) {
          StringSegment::adjustOffset(segment,iVar4);
        }
        local_5d = true;
        if (local_55 == false) {
          iVar6 = StringSegment::length(segment);
          local_5d = iVar4 == iVar6;
        }
        overlap_1._3_1_ = local_5d;
      }
      this_local._7_1_ = overlap_1._3_1_;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
CombinedCurrencyMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const {
    if (result.currencyCode[0] != 0) {
        return false;
    }

    // Try to match a currency spacing separator.
    int32_t initialOffset = segment.getOffset();
    bool maybeMore = false;
    if (result.seenNumber() && !beforeSuffixInsert.isEmpty()) {
        int32_t overlap = segment.getCommonPrefixLength(beforeSuffixInsert);
        if (overlap == beforeSuffixInsert.length()) {
            segment.adjustOffset(overlap);
            // Note: let currency spacing be a weak match. Don't update chars consumed.
        }
        maybeMore = maybeMore || overlap == segment.length();
    }

    // Match the currency string, and reset if we didn't find one.
    maybeMore = maybeMore || matchCurrency(segment, result, status);
    if (result.currencyCode[0] == 0) {
        segment.setOffset(initialOffset);
        return maybeMore;
    }

    // Try to match a currency spacing separator.
    if (!result.seenNumber() && !afterPrefixInsert.isEmpty()) {
        int32_t overlap = segment.getCommonPrefixLength(afterPrefixInsert);
        if (overlap == afterPrefixInsert.length()) {
            segment.adjustOffset(overlap);
            // Note: let currency spacing be a weak match. Don't update chars consumed.
        }
        maybeMore = maybeMore || overlap == segment.length();
    }

    return maybeMore;
}